

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_wrapper.cpp
# Opt level: O2

void __thiscall daw::curl_wrapper::set_body(curl_wrapper *this,string_view value)

{
  _Head_base<0UL,_daw::curl_wrapper::impl_t_*,_false> _Var1;
  
  _Var1._M_head_impl =
       (this->m_impl)._M_t.
       super___uniq_ptr_impl<daw::curl_wrapper::impl_t,_std::default_delete<daw::curl_wrapper::impl_t>_>
       ._M_t.
       super__Tuple_impl<0UL,_daw::curl_wrapper::impl_t_*,_std::default_delete<daw::curl_wrapper::impl_t>_>
       .super__Head_base<0UL,_daw::curl_wrapper::impl_t_*,_false>._M_head_impl;
  *(size_type *)((long)&(_Var1._M_head_impl)->body + 8) = 0;
  *((_Var1._M_head_impl)->body)._M_dataplus._M_p = 0;
  std::__cxx11::string::assign
            ((char *)&((this->m_impl)._M_t.
                       super___uniq_ptr_impl<daw::curl_wrapper::impl_t,_std::default_delete<daw::curl_wrapper::impl_t>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_daw::curl_wrapper::impl_t_*,_std::default_delete<daw::curl_wrapper::impl_t>_>
                       .super__Head_base<0UL,_daw::curl_wrapper::impl_t_*,_false>._M_head_impl)->
                      body,(ulong)value._M_str);
  ((this->m_impl)._M_t.
   super___uniq_ptr_impl<daw::curl_wrapper::impl_t,_std::default_delete<daw::curl_wrapper::impl_t>_>
   ._M_t.
   super__Tuple_impl<0UL,_daw::curl_wrapper::impl_t_*,_std::default_delete<daw::curl_wrapper::impl_t>_>
   .super__Head_base<0UL,_daw::curl_wrapper::impl_t_*,_false>._M_head_impl)->has_body = true;
  return;
}

Assistant:

void curl_wrapper::set_body( std::string_view value ) {
		m_impl->body.clear( );
		m_impl->body.assign( std::data( value ), std::size( value ) );
		m_impl->has_body = true;
	}